

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O3

UINT8 device_start_scsp(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  UINT8 UVar7;
  uint uVar8;
  DEV_DATA DVar9;
  void *pvVar10;
  undefined1 *puVar11;
  int iVar12;
  undefined4 uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int (*paiVar19) [256];
  uint uVar20;
  scsp_state *scsp;
  ulong uVar21;
  int (*paiVar22) [256];
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  DVar9.chipInf = calloc(1,0x82e58);
  if ((DEV_DATA *)DVar9.chipInf == (DEV_DATA *)0x0) {
    UVar7 = 0xff;
  }
  else {
    uVar18 = cfg->clock;
    SCSPDSP_Init((SCSPDSP *)((long)DVar9.chipInf + 0x82688));
    *(uint *)((long)DVar9.chipInf + 0x144c) = uVar18;
    *(uint *)&((DEV_DATA *)((long)DVar9.chipInf + 0x1450))->chipInf = uVar18 >> 9;
    *(undefined2 *)((long)DVar9.chipInf + 0x1476) = 0;
    *(undefined2 *)((long)DVar9.chipInf + 0x1454) = 0;
    *(undefined4 *)&((DEV_DATA *)((long)DVar9.chipInf + 0x1448))->chipInf = 0x80000;
    pvVar10 = malloc(0x80000);
    ((DEV_DATA *)((long)DVar9.chipInf + 0x1440))->chipInf = pvVar10;
    *(undefined4 *)&((DEV_DATA *)((long)DVar9.chipInf + 0x82690))->chipInf = 0x40000;
    ((DEV_DATA *)((long)DVar9.chipInf + 0x82688))->chipInf = pvVar10;
    lVar15 = 0x51e;
    iVar16 = -0xbfd;
    do {
      dVar2 = pow(10.0,(double)((float)iVar16 * 0.03125) / 20.0);
      *(int *)((long)DVar9.chipInf + lVar15 * 4) = (int)(dVar2 * 4096.0);
      lVar15 = lVar15 + 1;
      iVar16 = iVar16 + 3;
    } while (lVar15 != 0x91e);
    uVar21 = 0;
    do {
      fVar24 = 0.0;
      if ((uVar21 & 1) != 0) {
        fVar24 = -0.4;
      }
      uVar18 = (uint)uVar21;
      auVar25._0_4_ = -(uint)((uVar18 & 0xf00) == 0xf00);
      auVar25._4_4_ = -(uint)((uVar21 & 0x80) == 0);
      auVar25._8_4_ = -(uint)((uVar21 & 0x40) == 0);
      auVar25._12_4_ = -(uint)((uVar21 & 0x20) == 0);
      auVar26._0_4_ = -(uint)((uVar21 & 0x10) == 0);
      auVar26._4_4_ = -(uint)((uVar21 & 8) == 0);
      auVar26._8_4_ = -(uint)((uVar21 & 4) == 0);
      auVar26._12_4_ = -(uint)((uVar21 & 2) == 0);
      auVar26 = packssdw(auVar25,auVar26);
      auVar26 = packsswb(auVar26,auVar26);
      if ((auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -0.8;
      }
      if ((auVar26 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -1.5;
      }
      if ((auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -3.0;
      }
      if ((auVar26 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -6.0;
      }
      if ((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -12.0;
      }
      if ((auVar26 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -24.0;
      }
      if ((auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = fVar24 + -48.0;
      }
      dVar2 = pow(10.0,(double)fVar24 / 20.0);
      fVar24 = 0.0;
      if ((auVar26 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        fVar24 = 0.0;
        if ((uVar18 >> 8 & 1) != 0) {
          fVar24 = -3.0;
        }
        if ((uVar18 >> 9 & 1) != 0) {
          fVar24 = fVar24 + -6.0;
        }
        if ((uVar18 >> 10 & 1) != 0) {
          fVar24 = fVar24 + -12.0;
        }
        if ((uVar18 >> 0xb & 1) != 0) {
          fVar24 = fVar24 + -24.0;
        }
        dVar3 = pow(10.0,(double)fVar24 / 20.0);
        fVar24 = (float)dVar3 * 4.0;
      }
      if ((uVar18 >> 0xc & 1) == 0) {
        fVar6 = 4.0;
        fVar5 = fVar24;
      }
      else {
        fVar5 = 4.0;
        fVar6 = fVar24;
      }
      fVar24 = 0.0;
      if (0x1fff < uVar21) {
        dVar3 = pow(10.0,(double)SDLT[(uint)(uVar21 >> 0xd) & 0x7ffff] / 20.0);
        fVar24 = (float)dVar3;
      }
      *(int *)((long)DVar9.chipInf + uVar21 * 4 + 0x2478) =
           (int)(long)(fVar5 * (float)dVar2 * fVar24 * 4096.0);
      *(int *)((long)DVar9.chipInf + uVar21 * 4 + 0x42478) =
           (int)(long)(fVar6 * (float)dVar2 * fVar24 * 4096.0);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 0x10000);
    lVar15 = 0;
    ((DEV_DATA *)((long)DVar9.chipInf + 0x82588))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar9.chipInf + 0x82488))->chipInf = (void *)0x0;
    do {
      iVar16 = 0x4000000;
      if (lVar15 + 0xffffffc2U < 0xfffffffe) {
        iVar16 = (int)((1023000.0 / (ARTimes[lVar15 + 2] * 44100.0)) * 65536.0);
      }
      dVar2 = DRTimes[lVar15 + 2];
      *(int *)((long)DVar9.chipInf + lVar15 * 4 + 0x82490) = iVar16;
      *(int *)((long)DVar9.chipInf + lVar15 * 4 + 0x82590) =
           (int)((1023000.0 / (dVar2 * 44100.0)) * 65536.0);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x3e);
    puVar11 = (undefined1 *)((long)DVar9.chipInf + 0x59);
    lVar15 = 0;
    do {
      *(int *)(puVar11 + 0x6f) = (int)lVar15;
      *puVar11 = 0;
      *(undefined8 *)(puVar11 + 7) = 0;
      *(undefined4 *)(puVar11 + 0x1f) = 3;
      lVar15 = lVar15 + 1;
      puVar11 = puVar11 + 0x98;
    } while (lVar15 != 0x20);
    if (IsInit == '\0') {
      lVar15 = -0x400;
      uVar18 = 0x100;
      uVar20 = 0;
      iVar16 = 0xff;
      uVar21 = 0;
      do {
        iVar4 = (int)uVar21;
        uVar14 = uVar18 - 1;
        uVar8 = uVar14;
        if (uVar21 < 0x40) {
          uVar8 = uVar20;
        }
        *(int *)((long)PLFO_SAW + lVar15) = iVar16;
        bVar23 = uVar21 < 0x80;
        iVar12 = iVar4 + -0x100;
        if (bVar23) {
          iVar12 = iVar4;
        }
        *(int *)((long)ALFO_SQR + lVar15) = iVar12;
        uVar13 = 0;
        if (bVar23) {
          uVar13 = 0xff;
        }
        *(undefined4 *)((long)PLFO_SQR + lVar15) = uVar13;
        uVar13 = 0xffffff80;
        if (bVar23) {
          uVar13 = 0x7f;
        }
        *(undefined4 *)((long)ALFO_TRI + lVar15) = uVar13;
        if ((!bVar23) && (uVar8 = uVar18, uVar14 = uVar20 - 0x100, 0xbf < uVar21)) {
          uVar8 = iVar4 * 2 | 0xfffffe01;
        }
        *(uint *)((long)PLFO_TRI + lVar15) = uVar14;
        *(uint *)((long)ALFO_NOI + lVar15) = uVar8;
        uVar14 = rand();
        *(uint *)((long)PLFO_NOI + lVar15) = uVar14 & 0xff;
        *(uint *)((long)PSCALES[0] + lVar15) = 0x80 - (uVar14 & 0xff);
        uVar21 = uVar21 + 1;
        uVar18 = uVar18 - 2;
        uVar20 = uVar20 + 2;
        iVar16 = iVar16 + -1;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0);
      paiVar22 = PSCALES;
      paiVar19 = ASCALES;
      lVar15 = 0;
      do {
        fVar24 = PSCALE[lVar15];
        lVar17 = 0;
        do {
          dVar2 = exp2(((double)((float)((int)lVar17 + -0x80) * fVar24) * 0.0078125) / 1200.0);
          (*paiVar22)[lVar17] = (int)(long)(dVar2 * 256.0);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x100);
        fVar24 = AMPLITUDE_SCALE_LIMIT[lVar15];
        lVar17 = 0;
        do {
          dVar2 = pow(10.0,((double)((float)(int)lVar17 * -fVar24) * 0.00390625) / 20.0);
          (*paiVar19)[lVar17] = (int)(long)(dVar2 * 256.0);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x100);
        lVar15 = lVar15 + 1;
        paiVar22 = paiVar22 + 1;
        paiVar19 = paiVar19 + 1;
      } while (lVar15 != 8);
      IsInit = '\x01';
    }
    *(undefined2 *)&((DEV_DATA *)((long)DVar9.chipInf + 0x28))->chipInf = 0;
    lVar15 = 0x5a;
    do {
      *(undefined1 *)((long)DVar9.chipInf + lVar15) = 0;
      lVar15 = lVar15 + 0x98;
    } while (lVar15 != 0x135a);
    *(void **)DVar9.chipInf = DVar9.chipInf;
    UVar1 = *(UINT32 *)((long)DVar9.chipInf + 0x1450);
    retDevInf->dataPtr = (DEV_DATA *)DVar9.chipInf;
    retDevInf->sampleRate = UVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar7 = '\0';
  }
  return UVar7;
}

Assistant:

static UINT8 device_start_scsp(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	scsp_state *scsp;

	scsp = (scsp_state *)calloc(1, sizeof(scsp_state));
	if (scsp == NULL)
		return 0xFF;

	// init the emulation
	SCSP_Init(scsp, cfg->clock);

	scsp_set_mute_mask(scsp, 0x00000000);

	scsp->_devData.chipInf = scsp;
	INIT_DEVINF(retDevInf, &scsp->_devData, scsp->rate, &devDef);

	return 0x00;
}